

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  void *pvVar1;
  undefined4 in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  uint i;
  undefined4 local_28;
  undefined4 local_4;
  
  pvVar1 = lodepng_malloc(0x5e1025);
  *(void **)(in_RDI + 0x10) = pvVar1;
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = 0x53;
  }
  else {
    for (local_28 = 0; local_28 != in_RDX; local_28 = local_28 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + (ulong)local_28 * 4) =
           *(undefined4 *)(in_RSI + (ulong)local_28 * 4);
    }
    *(int *)(in_RDI + 0x1c) = (int)in_RDX;
    *(undefined4 *)(in_RDI + 0x18) = in_ECX;
    local_4 = HuffmanTree_makeFromLengths2(tree);
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
                                            size_t numcodes, unsigned maxbitlen)
{
  unsigned i;
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  for(i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->maxbitlen = maxbitlen;
  return HuffmanTree_makeFromLengths2(tree);
}